

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<84>::AddWithCarry
          (BigUnsigned<84> *this,int index,uint64_t value)

{
  uint32_t *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint32_t value_00;
  bool bVar5;
  
  if (index < 0x54 && value != 0) {
    value_00 = (uint32_t)(value >> 0x20);
    puVar1 = this->words_ + index;
    uVar4 = *puVar1;
    *puVar1 = *puVar1 + (uint)value;
    if ((CARRY4(uVar4,(uint)value)) && (value_00 = value_00 + 1, value_00 == 0)) {
      iVar2 = index + 2;
      if (index < 0x52) {
        uVar4 = 1;
        do {
          puVar1 = this->words_ + iVar2;
          bVar5 = CARRY4(*puVar1,uVar4);
          *puVar1 = *puVar1 + uVar4;
          iVar2 = iVar2 + (uint)bVar5;
          if (!bVar5) break;
          uVar4 = (uint)bVar5;
        } while (iVar2 < 0x54);
      }
      iVar3 = iVar2 + 1;
      if (iVar2 + 1 <= this->size_) {
        iVar3 = this->size_;
      }
      iVar2 = 0x54;
      if (iVar3 < 0x54) {
        iVar2 = iVar3;
      }
    }
    else {
      iVar2 = index + 1;
      if (value_00 != 0) {
        AddWithCarry(this,iVar2,value_00);
        return;
      }
      iVar3 = this->size_;
      if (this->size_ < iVar2) {
        iVar3 = iVar2;
      }
      iVar2 = 0x54;
      if (iVar3 < 0x54) {
        iVar2 = iVar3;
      }
    }
    this->size_ = iVar2;
  }
  return;
}

Assistant:

void AddWithCarry(int index, uint64_t value) {
    if (value && index < max_words) {
      uint32_t high = value >> 32;
      uint32_t low = value & 0xffffffff;
      words_[index] += low;
      if (words_[index] < low) {
        ++high;
        if (high == 0) {
          // Carry from the low word caused our high word to overflow.
          // Short circuit here to do the right thing.
          AddWithCarry(index + 2, static_cast<uint32_t>(1));
          return;
        }
      }
      if (high > 0) {
        AddWithCarry(index + 1, high);
      } else {
        // Normally 32-bit AddWithCarry() sets size_, but since we don't call
        // it when `high` is 0, do it ourselves here.
        size_ = (std::min)(max_words, (std::max)(index + 1, size_));
      }
    }
  }